

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thermo.cpp
# Opt level: O2

Vector3d * __thiscall
OpenMD::Thermo::getAngularMomentum(Vector3d *__return_storage_ptr__,Thermo *this)

{
  Snapshot *this_00;
  Molecule *this_01;
  RealType s;
  MoleculeIterator i;
  Vector3d angularMomentum;
  Vector3d thisp;
  Vector3d thisr;
  Vector3d comVel;
  Vector3d com;
  MoleculeIterator local_f8;
  Vector<double,_3U> local_f0;
  Vector<double,_3U> local_d8;
  Vector<double,_3U> local_c0;
  Vector<double,_3U> local_a8;
  Vector<double,_3U> local_90;
  Vector<double,_3U> local_78;
  Vector<double,_3U> local_60;
  Vector<double,_3U> local_48;
  
  this_00 = this->info_->sman_->currentSnapshot_;
  if (this_00->hasCOMw == false) {
    local_f0.data_[0] = 0.0;
    Vector<double,_3U>::Vector(&local_a8,local_f0.data_);
    Vector<double,_3U>::Vector(&local_78,&local_a8);
    local_c0.data_[0] = 0.0;
    Vector<double,_3U>::Vector(&local_f0,local_c0.data_);
    Vector<double,_3U>::Vector(&local_a8,&local_f0);
    local_d8.data_[0] = 0.0;
    Vector<double,_3U>::Vector(&local_c0,local_d8.data_);
    Vector<double,_3U>::Vector(&local_f0,&local_c0);
    getComAll(this,(Vector3d *)&local_78,(Vector3d *)&local_a8);
    local_f8._M_node = (_Base_ptr)0x0;
    local_90.data_[0] = 0.0;
    Vector<double,_3U>::Vector(&local_d8,local_90.data_);
    Vector<double,_3U>::Vector(&local_c0,&local_d8);
    local_48.data_[0] = 0.0;
    Vector<double,_3U>::Vector(&local_90,local_48.data_);
    Vector<double,_3U>::Vector(&local_d8,&local_90);
    this_01 = SimInfo::beginMolecule(this->info_,&local_f8);
    while (this_01 != (Molecule *)0x0) {
      s = Molecule::getMass(this_01);
      Molecule::getCom((Vector3d *)&local_48,this_01);
      operator-(&local_90,&local_48,&local_78);
      Vector3<double>::operator=((Vector3<double> *)&local_c0,&local_90);
      Molecule::getComVel((Vector3d *)&local_60,this_01);
      operator-(&local_48,&local_60,&local_a8);
      operator*(&local_90,&local_48,s);
      Vector3<double>::operator=((Vector3<double> *)&local_d8,&local_90);
      cross<double>((Vector3<double> *)&local_90,(Vector3<double> *)&local_c0,
                    (Vector3<double> *)&local_d8);
      Vector<double,_3U>::add(&local_f0,&local_90);
      this_01 = SimInfo::nextMolecule(this->info_,&local_f8);
    }
    Snapshot::setCOMw(this_00,(Vector3d *)&local_f0);
  }
  Snapshot::getCOMw(__return_storage_ptr__,this_00);
  return __return_storage_ptr__;
}

Assistant:

Vector3d Thermo::getAngularMomentum() {
    Snapshot* snap = info_->getSnapshotManager()->getCurrentSnapshot();

    if (!snap->hasCOMw) {
      Vector3d com(0.0);
      Vector3d comVel(0.0);
      Vector3d angularMomentum(0.0);

      getComAll(com, comVel);

      SimInfo::MoleculeIterator i;
      Molecule* mol;

      Vector3d thisr(0.0);
      Vector3d thisp(0.0);

      RealType thisMass;

      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        thisMass = mol->getMass();
        thisr    = mol->getCom() - com;
        thisp    = (mol->getComVel() - comVel) * thisMass;

        angularMomentum += cross(thisr, thisp);
      }

#ifdef IS_MPI
      MPI_Allreduce(MPI_IN_PLACE, angularMomentum.getArrayPointer(), 3,
                    MPI_REALTYPE, MPI_SUM, MPI_COMM_WORLD);
#endif

      snap->setCOMw(angularMomentum);
    }

    return snap->getCOMw();
  }